

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O2

bool __thiscall
directed_flag_complex_in_memory_computer::
coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::has_next(coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  const_iterator local_78;
  const_iterator local_58;
  _Self local_38;
  
  if ((long)this->index != 0xffffffffffffffff) {
    compressed_sparse_matrix<int>::cbegin(&local_58,this->matrix,(long)this->index);
    std::operator+(&local_38,&local_58,this->current_offset);
    compressed_sparse_matrix<int>::cend(&local_78,this->matrix,(long)this->index);
    return local_38._M_cur != local_78._M_cur;
  }
  return false;
}

Assistant:

bool has_next() { return index != -1 && matrix.cbegin(index) + current_offset != matrix.cend(index); }